

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int solver2_lit_removable_rec(sat_solver2 *s,int v)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int *piVar4;
  varinfo2 *pvVar5;
  ulong uVar6;
  int iVar7;
  
  pvVar5 = s->vi;
  bVar2 = *(byte *)(pvVar5 + v);
  if ((bVar2 >> 2 & 2) == 0) {
    uVar3 = s->reasons[v];
    if (uVar3 == 0) {
      if ((bVar2 & 0x3c) == 0) {
        uVar3 = (s->tagged).size;
        if (uVar3 == (s->tagged).cap) {
          iVar7 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar7 = uVar3 * 2;
          }
          piVar4 = (s->tagged).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
          }
          (s->tagged).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar7 * 9.5367431640625e-07
                  );
            fflush(_stdout);
          }
          (s->tagged).cap = iVar7;
          uVar3 = (s->tagged).size;
          pvVar5 = s->vi;
        }
        (s->tagged).size = uVar3 + 1;
        (s->tagged).ptr[(int)uVar3] = v;
        bVar2 = *(byte *)(pvVar5 + v);
      }
      *(byte *)(pvVar5 + v) = bVar2 | 8;
LAB_008ea1e2:
      uVar3 = 0;
    }
    else {
      uVar1 = (s->Mem).uPageMask & uVar3;
      if (uVar1 == 0) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                      ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
      }
      piVar4 = (s->Mem).pPages[(int)uVar3 >> ((byte)(s->Mem).nPageSize & 0x1f)];
      if (0xfff < (uint)piVar4[(int)uVar1]) {
        uVar6 = 1;
        do {
          pvVar5 = s->vi;
          if ((uint)piVar4[(long)(int)uVar1 + uVar6 + 1] < 2) goto LAB_008e9f15;
          iVar7 = piVar4[(long)(int)uVar1 + uVar6 + 1] >> 1;
          if ((*(byte *)(pvVar5 + iVar7) & 4) == 0) {
            bVar2 = *(byte *)(pvVar5 + iVar7) >> 2 & 0xf;
            if ((bVar2 != 6) && (s->levels[iVar7] != 0)) {
              if ((bVar2 != 2) && ((s->trail_lim).ptr[s->levels[iVar7]] < 0)) {
                iVar7 = solver2_lit_removable_rec(s,iVar7);
                if (iVar7 != 0) goto LAB_008e9efa;
                pvVar5 = s->vi;
              }
              bVar2 = *(byte *)(pvVar5 + v);
              if ((bVar2 & 0x3c) == 0) {
                uVar3 = (s->tagged).size;
                if (uVar3 == (s->tagged).cap) {
                  iVar7 = (uVar3 >> 1) * 3;
                  if ((int)uVar3 < 4) {
                    iVar7 = uVar3 * 2;
                  }
                  piVar4 = (s->tagged).ptr;
                  if (piVar4 == (int *)0x0) {
                    piVar4 = (int *)malloc((long)iVar7 << 2);
                  }
                  else {
                    piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
                  }
                  (s->tagged).ptr = piVar4;
                  if (piVar4 == (int *)0x0) {
                    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                           (double)(s->tagged).cap * 9.5367431640625e-07,
                           (double)iVar7 * 9.5367431640625e-07);
                    fflush(_stdout);
                  }
                  (s->tagged).cap = iVar7;
                  uVar3 = (s->tagged).size;
                  pvVar5 = s->vi;
                }
                (s->tagged).size = uVar3 + 1;
                (s->tagged).ptr[(int)uVar3] = v;
                bVar2 = *(byte *)(pvVar5 + v);
              }
              *(byte *)(pvVar5 + v) = bVar2 | 8;
              goto LAB_008ea1e2;
            }
          }
          else {
            solver2_lit_removable_rec(s,iVar7);
          }
LAB_008e9efa:
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)piVar4[(int)uVar1] >> 0xb);
        pvVar5 = s->vi;
      }
LAB_008e9f15:
      if ((s->fProofLogging != 0) && (((uint)pvVar5[v] & 4) != 0)) {
        uVar3 = (s->min_lit_order).size;
        if (uVar3 == (s->min_lit_order).cap) {
          iVar7 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar7 = uVar3 * 2;
          }
          piVar4 = (s->min_lit_order).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
          }
          (s->min_lit_order).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->min_lit_order).cap * 9.5367431640625e-07,
                   (double)iVar7 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          (s->min_lit_order).cap = iVar7;
          uVar3 = (s->min_lit_order).size;
          pvVar5 = s->vi;
        }
        (s->min_lit_order).size = uVar3 + 1;
        (s->min_lit_order).ptr[(int)uVar3] = v;
      }
      bVar2 = *(byte *)(pvVar5 + v);
      if ((bVar2 & 0x3c) == 0) {
        uVar3 = (s->tagged).size;
        if (uVar3 == (s->tagged).cap) {
          iVar7 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar7 = uVar3 * 2;
          }
          piVar4 = (s->tagged).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
          }
          (s->tagged).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar7 * 9.5367431640625e-07
                  );
            fflush(_stdout);
          }
          (s->tagged).cap = iVar7;
          uVar3 = (s->tagged).size;
          pvVar5 = s->vi;
        }
        (s->tagged).size = uVar3 + 1;
        (s->tagged).ptr[(int)uVar3] = v;
        bVar2 = *(byte *)(pvVar5 + v);
      }
      *(byte *)(pvVar5 + v) = bVar2 | 0x18;
      uVar3 = 1;
    }
  }
  else {
    uVar3 = bVar2 >> 4 & 1;
  }
  return uVar3;
}

Assistant:

static int solver2_lit_removable_rec(sat_solver2* s, int v)
{
    // tag[0]: True if original conflict clause literal.
    // tag[1]: Processed by this procedure
    // tag[2]: 0=non-removable, 1=removable

    clause* c;
    int i, x;

    // skip visited
    if (var_tag(s,v) & 2)
        return (var_tag(s,v) & 4) > 0;

    // skip decisions on a wrong level
    c = clause2_read(s, var_reason(s,v));
    if ( c == NULL ){
        var_add_tag(s,v,2);
        return 0;
    }

    clause_foreach_var( c, x, i, 1 ){
        if (var_tag(s,x) & 1)
            solver2_lit_removable_rec(s, x);
        else{
            if (var_level(s,x) == 0 || var_tag(s,x) == 6) continue;     // -- 'x' checked before, found to be removable (or belongs to the toplevel)
            if (var_tag(s,x) == 2 || !var_lev_mark(s,x) || !solver2_lit_removable_rec(s, x))
            {  // -- 'x' checked before, found NOT to be removable, or it belongs to a wrong level, or cannot be removed
                var_add_tag(s,v,2);
                return 0;
            }
        }
    }
    if ( s->fProofLogging && (var_tag(s,v) & 1) )
        veci_push(&s->min_lit_order, v );
    var_add_tag(s,v,6);
    return 1;
}